

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_mixer.cpp
# Opt level: O3

int __thiscall MixerContext::init(MixerContext *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  int ch_in;
  uint32_t j;
  int iVar8;
  long lVar9;
  ulong uVar10;
  double (*padVar11) [32];
  int32_t (*paiVar12) [32];
  ulong uVar13;
  double dVar14;
  double dVar15;
  
  iVar1 = auto_matrix(this);
  iVar2 = -1;
  if (iVar1 == 0) {
    if (this->_format == CUBEB_SAMPLE_S16LE) {
      uVar7 = this->_out_ch_count;
      if (uVar7 != 0) {
        padVar11 = this->_matrix;
        uVar6 = (ulong)this->_in_ch_count;
        uVar13 = 0;
        iVar1 = 0;
        do {
          iVar8 = 0;
          iVar2 = (int)uVar6;
          uVar6 = 0;
          if (iVar2 != 0) {
            uVar10 = 0;
            dVar14 = 0.0;
            iVar8 = 0;
            do {
              dVar15 = (*padVar11)[uVar10] * 32768.0 + dVar14;
              lVar5 = lrintf((float)dVar15);
              iVar3 = (int)lVar5;
              dVar14 = dVar14 + (dVar15 - (double)iVar3);
              iVar2 = -iVar3;
              if (0 < iVar3) {
                iVar2 = iVar3;
              }
              iVar8 = iVar8 + iVar2;
              uVar10 = uVar10 + 1;
              uVar6 = (ulong)this->_in_ch_count;
            } while (uVar10 < uVar6);
            uVar7 = this->_out_ch_count;
          }
          if (iVar1 <= iVar8) {
            iVar1 = iVar8;
          }
          uVar13 = uVar13 + 1;
          padVar11 = padVar11 + 1;
        } while (uVar13 < uVar7);
        if (0x8000 < iVar1) {
          this->_clipping = true;
        }
      }
    }
    padVar11 = this->_matrix;
    paiVar12 = this->_matrix32;
    lVar5 = 0;
    do {
      lVar9 = 0;
      iVar1 = 0;
      do {
        lVar4 = lrintf((float)((*padVar11)[lVar9] * 32768.0));
        (*paiVar12)[lVar9] = (int32_t)lVar4;
        if (((*padVar11)[lVar9] != 0.0) || (NAN((*padVar11)[lVar9]))) {
          lVar4 = (long)iVar1;
          iVar1 = iVar1 + 1;
          this->_matrix_ch[lVar5][lVar4 + 1] = (uint8_t)lVar9;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x20);
      this->_matrix_ch[lVar5][0] = (uint8_t)iVar1;
      lVar5 = lVar5 + 1;
      padVar11 = padVar11 + 1;
      paiVar12 = paiVar12 + 1;
    } while (lVar5 != 0x20);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int MixerContext::init()
{
  int r = auto_matrix();
  if (r) {
    return r;
  }

  // Determine if matrix operation would overflow
  if (_format == CUBEB_SAMPLE_S16NE) {
    int maxsum = 0;
    for (uint32_t i = 0; i < _out_ch_count; i++) {
      double rem = 0;
      int sum = 0;

      for (uint32_t j = 0; j < _in_ch_count; j++) {
        double target = _matrix[i][j] * 32768 + rem;
        int value = lrintf(target);
        rem += target - value;
        sum += std::abs(value);
      }
      maxsum = std::max(maxsum, sum);
    }
    if (maxsum > 32768) {
      _clipping = true;
    }
  }

  // FIXME quantize for integers
  for (uint32_t i = 0; i < CHANNELS_MAX; i++) {
    int ch_in = 0;
    for (uint32_t j = 0; j < CHANNELS_MAX; j++) {
      _matrix32[i][j] = lrintf(_matrix[i][j] * 32768);
      if (_matrix[i][j]) {
        _matrix_ch[i][++ch_in] = j;
      }
    }
    _matrix_ch[i][0] = ch_in;
  }

  return 0;
}